

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

char * llvm::writeUnsignedDecimal(char *dst,uint n)

{
  char **ppcVar1;
  char *pcVar2;
  char **local_50;
  char *p;
  char buff [40];
  uint local_14;
  char *pcStack_10;
  uint n_local;
  char *dst_local;
  
  local_50 = &p;
  local_14 = n;
  do {
    ppcVar1 = (char **)((long)local_50 + 1);
    *(char *)local_50 = (char)((ulong)local_14 % 10) + '0';
    local_14 = local_14 / 10;
    local_50 = ppcVar1;
    pcStack_10 = dst;
  } while (local_14 != 0);
  do {
    ppcVar1 = (char **)((long)local_50 + -1);
    pcVar2 = pcStack_10 + 1;
    *pcStack_10 = *(char *)((long)local_50 + -1);
    local_50 = ppcVar1;
    pcStack_10 = pcVar2;
  } while (ppcVar1 != &p);
  return pcVar2;
}

Assistant:

static char *
writeUnsignedDecimal (char *dst, unsigned int n)
{
  char buff[40], *p;

  p = buff;
  do
    *p++ = '0' + n % 10;
  while (n /= 10);

  do
    *dst++ = *--p;
  while (p != buff);

  return dst;
}